

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O2

void nt(LispPTR index)

{
  LispPTR LVar1;
  LispPTR *pLVar2;
  fnhead *fnobj;
  
  if ((index & 0xfff0000) == 0) {
    pLVar2 = (LispPTR *)(AtomSpace + (ulong)(index * 5) * 2);
  }
  else {
    pLVar2 = NativeAligned4FromLAddr(index);
  }
  fnobj = (fnhead *)NativeAligned4FromLAddr(pLVar2[2] & 0xfffffff);
  if ((*(uint *)&fnobj->field_0x8 & 0xfffffff) == index) {
    printf("***DUMP Func Header << ");
    LVar1 = LAddrFromNative(fnobj);
    printf("start at 0x%x lisp address(%p 68k)\n",(ulong)LVar1,fnobj);
    print(index);
    putchar(10);
    ntheader(fnobj);
    return;
  }
  printf("DEFCELL says it is ");
  print_atomname(index);
  printf("\n But Func OBJ says ");
  print_atomname(*(uint *)&fnobj->field_0x8 & 0xfffffff);
  putchar(10);
  return;
}

Assistant:

void nt(LispPTR index)
/* atom index */
{
  struct fnhead *fnobj;
  DefCell *defcell68k;

  defcell68k = (DefCell *)GetDEFCELL68k(index);
  fnobj = (struct fnhead *)NativeAligned4FromLAddr(defcell68k->defpointer);

  /* check if it's the same index ??*/
  if (index != (fnobj->framename)) {
    printf("DEFCELL says it is ");
    print_atomname(index);
    printf("\n But Func OBJ says ");
    print_atomname(fnobj->framename);
    putchar('\n');
    return;
  }

  printf("***DUMP Func Header << ");
  printf("start at 0x%x lisp address(%p 68k)\n", LAddrFromNative(fnobj), (void *)fnobj);
  print(index);
  putchar('\n');

  ntheader(fnobj);
}